

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

void mbedtls_pem_free(mbedtls_pem_context *ctx)

{
  uchar *puVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  
  puVar1 = ctx->buf;
  if ((puVar1 != (uchar *)0x0) && (sVar2 = ctx->buflen, sVar2 != 0)) {
    sVar4 = 0;
    do {
      puVar1[sVar4] = '\0';
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  free(ctx->buf);
  free(ctx->info);
  lVar3 = 0;
  do {
    *(undefined1 *)((long)&ctx->buf + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x18);
  return;
}

Assistant:

void mbedtls_pem_free( mbedtls_pem_context *ctx )
{
    if( ctx->buf != NULL )
        mbedtls_zeroize( ctx->buf, ctx->buflen );
    mbedtls_free( ctx->buf );
    mbedtls_free( ctx->info );

    mbedtls_zeroize( ctx, sizeof( mbedtls_pem_context ) );
}